

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_true>::delete_sib_(DaTrie<true,_true,_true> *this,uint32_t node_pos)

{
  byte bVar1;
  uint8_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t _node_pos;
  uint8_t label;
  uint32_t base;
  uint32_t parent_pos;
  uint local_1c;
  
  sVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(in_RDI);
  if (sVar6 <= in_ESI) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x22f,
                  "void ddd::DaTrie<true, true, true>::delete_sib_(uint32_t) [WithBLM = true, WithNLM = true, Prefix = true]"
                 );
  }
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar3 = Bc::is_fixed(pvVar7);
  if (!bVar3) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x230,
                  "void ddd::DaTrie<true, true, true>::delete_sib_(uint32_t) [WithBLM = true, WithNLM = true, Prefix = true]"
                 );
  }
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  uVar4 = Bc::check(pvVar7);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
  uVar5 = Bc::base(pvVar7);
  pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)uVar4);
  bVar1 = pvVar8->child;
  while( true ) {
    local_1c = uVar5 ^ bVar1;
    pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)local_1c);
    if (pvVar8->sib == (byte)((byte)uVar5 ^ (byte)in_ESI)) break;
    pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)local_1c);
    bVar1 = pvVar8->sib;
  }
  pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)uVar4);
  uVar2 = pvVar8->child;
  pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)local_1c);
  if (uVar2 == pvVar8->sib) {
    pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)in_ESI);
    uVar2 = pvVar8->sib;
    pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)uVar4);
    pvVar8->child = uVar2;
  }
  pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)in_ESI);
  uVar2 = pvVar8->sib;
  pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)local_1c);
  pvVar8->sib = uVar2;
  return;
}

Assistant:

void delete_sib_(uint32_t node_pos) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto parent_pos = bc_[node_pos].check();
    auto base = bc_[parent_pos].base();
    auto label = static_cast<uint8_t>(base ^ node_pos);

    auto _node_pos = base ^node_links_[parent_pos].child;
    while (node_links_[_node_pos].sib != label) {
      _node_pos = base ^ node_links_[_node_pos].sib;
    }

    if (node_links_[parent_pos].child == node_links_[_node_pos].sib) {
      node_links_[parent_pos].child = node_links_[node_pos].sib;
    }
    node_links_[_node_pos].sib = node_links_[node_pos].sib;
  }